

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O0

void __thiscall UDMFParser::ParseVertex(UDMFParser *this,vertex_t *vt,vertexdata_t *vd)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  double dVar4;
  undefined1 local_34 [8];
  FName key;
  double y;
  double x;
  vertexdata_t *vd_local;
  vertex_t *vt_local;
  UDMFParser *this_local;
  
  vertex_t::set(vt,0,0);
  vd->flags = 0;
  vd->zFloor = 0.0;
  vd->zCeiling = 0.0;
  FScanner::MustGetToken((FScanner *)this,0x7b);
  while (bVar1 = FScanner::CheckToken((FScanner *)this,0x7d), ((bVar1 ^ 0xffU) & 1) != 0) {
    UDMFParserBase::ParseKey((UDMFParserBase *)local_34,SUB81(this,0),(bool *)0x0);
    iVar2 = FName::operator_cast_to_int((FName *)local_34);
    switch(iVar2) {
    case 0xea:
      pcVar3 = FName::operator_cast_to_char_((FName *)local_34);
      y = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar3);
      break;
    case 0xeb:
      pcVar3 = FName::operator_cast_to_char_((FName *)local_34);
      register0x00001200 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar3);
      break;
    default:
      break;
    case 0x108:
      pcVar3 = FName::operator_cast_to_char_((FName *)local_34);
      dVar4 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar3);
      vd->zFloor = dVar4;
      vd->flags = vd->flags | 2;
      break;
    case 0x109:
      pcVar3 = FName::operator_cast_to_char_((FName *)local_34);
      dVar4 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar3);
      vd->zCeiling = dVar4;
      vd->flags = vd->flags | 1;
    }
  }
  vertex_t::set(vt,y,stack0xffffffffffffffd0);
  return;
}

Assistant:

void ParseVertex(vertex_t *vt, vertexdata_t *vd)
	{
		vt->set(0, 0);
		vd->zCeiling = vd->zFloor = vd->flags = 0;

		sc.MustGetToken('{');
		double x, y;
		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();
			switch (key)
			{
			case NAME_X:
				x = CheckFloat(key);
				break;

			case NAME_Y:
				y = CheckFloat(key);
				break;

			case NAME_ZCeiling:
				vd->zCeiling = CheckFloat(key);
				vd->flags |= VERTEXFLAG_ZCeilingEnabled;
				break;

			case NAME_ZFloor:
				vd->zFloor = CheckFloat(key);
				vd->flags |= VERTEXFLAG_ZFloorEnabled;
				break;

			default:
				break;
			}
		}
		vt->set(x, y);
	}